

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall testing::InSequence::~InSequence(InSequence *this)

{
  Sequence *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Sequence **ppSVar2;
  
  if (this->sequence_created_ == true) {
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)&internal::g_gmock_implicit_sequence);
    pSVar1 = *ppSVar2;
    if ((pSVar1 != (Sequence *)0x0) &&
       (this_00 = (pSVar1->last_expectation_).
                  super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi, this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    operator_delete(pSVar1,0x10);
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)&internal::g_gmock_implicit_sequence);
    *ppSVar2 = (Sequence *)0x0;
  }
  return;
}

Assistant:

InSequence::~InSequence() {
  if (sequence_created_) {
    delete internal::g_gmock_implicit_sequence.get();
    internal::g_gmock_implicit_sequence.set(nullptr);
  }
}